

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O2

bool __thiscall
Assimp::IFC::ProcessRepresentationItem
          (IFC *this,IfcRepresentationItem *item,uint matid,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *mesh_indices,
          ConversionData *conv)

{
  bool bVar1;
  uint matid_00;
  undefined4 in_register_00000014;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *mesh_indices_00;
  bool bVar2;
  
  mesh_indices_00 =
       (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
       CONCAT44(in_register_00000014,matid);
  matid_00 = ProcessMaterials(*(uint64_t *)(this + *(long *)(*(long *)this + -0x18) + 8),(uint)item,
                              (ConversionData *)mesh_indices,true);
  bVar1 = TryQueryMeshCache(this,(IfcRepresentationItem *)mesh_indices_00,
                            (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)(ulong)matid_00,(uint)mesh_indices,conv);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = ProcessGeometricItem
                      ((IfcRepresentationItem *)this,matid_00,mesh_indices_00,
                       (ConversionData *)mesh_indices);
    if (bVar1) {
      if ((mesh_indices_00->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
        PopulateMeshCache((IfcRepresentationItem *)this,mesh_indices_00,matid_00,
                          (ConversionData *)mesh_indices);
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool ProcessRepresentationItem(const Schema_2x3::IfcRepresentationItem& item, unsigned int matid,
    std::set<unsigned int>& mesh_indices,
    ConversionData& conv)
{
    // determine material
    unsigned int localmatid = ProcessMaterials(item.GetID(), matid, conv, true);

    if (!TryQueryMeshCache(item,mesh_indices,localmatid,conv)) {
        if(ProcessGeometricItem(item,localmatid,mesh_indices,conv)) {
            if(mesh_indices.size()) {
                PopulateMeshCache(item,mesh_indices,localmatid,conv);
            }
        }
        else return false;
    }
    return true;
}